

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.h
# Opt level: O0

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::CopyBeginTo
          (CordRepBtree *this,size_t end,size_t new_length)

{
  size_t sVar1;
  size_t sVar2;
  iterator ppCVar3;
  CordRep *edge;
  iterator __end2;
  iterator __begin2;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *local_30;
  Span<absl::lts_20250127::cord_internal::CordRep_*const> *__range2;
  CordRepBtree *tree;
  size_t new_length_local;
  size_t end_local;
  CordRepBtree *this_local;
  
  tree = (CordRepBtree *)new_length;
  new_length_local = end;
  end_local = (size_t)this;
  sVar2 = capacity(this);
  sVar1 = new_length_local;
  if (sVar2 < end) {
    __assert_fail("end <= capacity()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x2cb,
                  "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
                 );
  }
  sVar2 = begin(this);
  if (sVar2 <= sVar1) {
    __range2 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)CopyRaw(this,(size_t)tree)
    ;
    set_end((CordRepBtree *)__range2,new_length_local);
    ___begin2 = Edges((CordRepBtree *)__range2);
    local_30 = (Span<absl::lts_20250127::cord_internal::CordRep_*const> *)&__begin2;
    __end2 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::begin(local_30);
    ppCVar3 = Span<absl::lts_20250127::cord_internal::CordRep_*const>::end(local_30);
    for (; __end2 != ppCVar3; __end2 = __end2 + 1) {
      CordRep::Ref(*__end2);
    }
    return (CordRepBtree *)__range2;
  }
  __assert_fail("end >= this->begin()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,0x2cc,
                "CordRepBtree *absl::cord_internal::CordRepBtree::CopyBeginTo(size_t, size_t) const"
               );
}

Assistant:

inline CordRepBtree* CordRepBtree::CopyBeginTo(size_t end,
                                               size_t new_length) const {
  assert(end <= capacity());
  assert(end >= this->begin());
  CordRepBtree* tree = CopyRaw(new_length);
  tree->set_end(end);
  for (CordRep* edge : tree->Edges()) CordRep::Ref(edge);
  return tree;
}